

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSceneSphereBoundMSFT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  bool bVar1;
  invalid_argument *this;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  XrSceneSphereBoundMSFT *in_stack_fffffffffffffdb8;
  string radius_prefix;
  string center_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [32];
  string local_1c0;
  ostringstream oss_radius;
  undefined8 local_198 [46];
  
  PointerToHexString<XrSceneSphereBoundMSFT>(in_stack_fffffffffffffdb8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_radius);
  std::__cxx11::string::~string((string *)&oss_radius);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&center_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&center_prefix);
  std::__cxx11::string::string((string *)(local_1e0 + 0x20),(string *)&center_prefix);
  gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_1e0;
  std::__cxx11::string::string
            ((string *)gen_dispatch_table_00,"XrVector3f",(allocator *)&oss_radius);
  bVar1 = ApiDumpOutputXrStruct
                    (gen_dispatch_table_00,&value->center,(string *)(local_1e0 + 0x20),
                     (string *)local_1e0,false,contents);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)(local_1e0 + 0x20));
  if (bVar1) {
    std::__cxx11::string::string((string *)&radius_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&radius_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_radius);
    *(undefined8 *)((long)local_198 + *(long *)(_oss_radius + -0x18)) = 0x20;
    std::ostream::operator<<((ostream *)&oss_radius,value->radius);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&radius_prefix,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_radius);
    std::__cxx11::string::~string((string *)&radius_prefix);
    std::__cxx11::string::~string((string *)&center_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSceneSphereBoundMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string center_prefix = prefix;
        center_prefix += "center";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->center, center_prefix, "XrVector3f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string radius_prefix = prefix;
        radius_prefix += "radius";
        std::ostringstream oss_radius;
        oss_radius << std::setprecision(32) << (value->radius);
        contents.emplace_back("float", radius_prefix, oss_radius.str());
        return true;
    } catch(...) {
    }
    return false;
}